

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::CheckResources(ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags,
                SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  int iVar1;
  PipelineResourceDesc *pPVar2;
  IDeviceObject *pIVar3;
  undefined4 extraout_var;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS SVar4;
  uint ArrayIndex;
  
  pPVar2 = ShaderVariableManagerGL::GetResourceDesc(this->m_ParentManager,this->m_ResIndex);
  SVar4 = 1 << (pPVar2->VarType & 0x1f);
  if ((((Flags >> (pPVar2->VarType & 0x1f) & 1) != 0) &&
      ((*StaleVarTypes & SVar4) == SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE)) &&
     (pPVar2->ArraySize != 0)) {
    ArrayIndex = 0;
    do {
      pIVar3 = ShaderVariableManagerGL::TextureBindInfo::Get((TextureBindInfo *)this,ArrayIndex);
      if (pIVar3 == (IDeviceObject *)0x0) {
        if ((Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) != 0) goto LAB_001bb345;
        if (pResourceMapping != (IResourceMapping *)0x0) goto LAB_001bb316;
      }
      else if (pResourceMapping != (IResourceMapping *)0x0 &&
               (char)((Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) >> 3) == '\0') {
LAB_001bb316:
        iVar1 = (*(pResourceMapping->super_IObject)._vptr_IObject[7])
                          (pResourceMapping,pPVar2->Name,(ulong)ArrayIndex);
        if ((IDeviceObject *)CONCAT44(extraout_var,iVar1) != (IDeviceObject *)0x0 &&
            (IDeviceObject *)CONCAT44(extraout_var,iVar1) != pIVar3) {
LAB_001bb345:
          *StaleVarTypes = *StaleVarTypes | SVar4;
          return;
        }
      }
      ArrayIndex = ArrayIndex + 1;
    } while (ArrayIndex < pPVar2->ArraySize);
  }
  return;
}

Assistant:

void CheckResources(IResourceMapping* pResourceMapping, BIND_SHADER_RESOURCES_FLAGS Flags, SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
    {
        const ThisImplType* const   pThis   = static_cast<const ThisImplType*>(this);
        const PipelineResourceDesc& ResDesc = pThis->GetDesc();

        const SHADER_RESOURCE_VARIABLE_TYPE_FLAGS VarTypeFlag = static_cast<SHADER_RESOURCE_VARIABLE_TYPE_FLAGS>(1u << ResDesc.VarType);
        if ((Flags & VarTypeFlag) == 0)
            return; // This variable type is not being processed

        if ((StaleVarTypes & VarTypeFlag) != 0)
            return; // This variable type is already stale

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            const IDeviceObject* const pBoundObj = pThis->Get(ArrInd);
            if ((pBoundObj != nullptr) && (Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) != 0)
                continue;

            if ((pBoundObj == nullptr) && (Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) != 0)
            {
                StaleVarTypes |= VarTypeFlag;
                return;
            }

            if (pResourceMapping != nullptr)
            {
                if (IDeviceObject* pObj = pResourceMapping->GetResource(ResDesc.Name, ArrInd))
                {
                    if (pObj != pBoundObj)
                    {
                        StaleVarTypes |= VarTypeFlag;
                        return;
                    }
                }
            }
        }
    }